

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O2

void __thiscall SignedInt_Signed_Test::TestBody(SignedInt_Signed_Test *this)

{
  int v;
  ParamType_conflict2 *pPVar1;
  string *lhs;
  char *message;
  ScopedTrace gtest_trace_283;
  AssertHelper local_208;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  ostringstream os;
  ostringstream stdos;
  
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_283,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0x11b,"SignedInt");
  pPVar1 = testing::WithParamInterface<int>::GetParam();
  v = *pPVar1;
  pstore::exchange::export_ns::ostringstream::ostringstream(&os);
  pstore::exchange::export_ns::ostream_base::write<int,void,void>(&os.super_ostream_base,v);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stdos);
  std::ostream::operator<<(&stdos,v);
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&os);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"os.str ()","stdos.str ()",lhs,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0xd8,message);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((long *)local_1f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1f0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stdos);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&os);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_283);
  return;
}

Assistant:

TEST_P (SignedInt, Signed) {
    SCOPED_TRACE ("SignedInt");
    check (GetParam ());
}